

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O0

int oonf_packet_send(oonf_packet_socket *pktsocket,netaddr_socket *remote,void *data,size_t length)

{
  oonf_log_source oVar1;
  byte bVar2;
  ssize_t sVar3;
  undefined8 uVar4;
  int *piVar5;
  char *pcVar6;
  int iVar7;
  os_fd *poVar8;
  undefined8 in_stack_fffffffffffffec0;
  undefined4 uVar9;
  undefined8 in_stack_fffffffffffffed0;
  undefined4 uVar10;
  char *local_108;
  undefined1 local_ea [8];
  netaddr_str buf;
  int result;
  size_t length_local;
  void *data_local;
  netaddr_socket *remote_local;
  oonf_packet_socket *pktsocket_local;
  int local_50;
  undefined2 local_1a;
  autobuf *local_18;
  
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  unique0x10000311 = length;
  if ((pktsocket->out)._len == 0) {
    poVar8 = &(pktsocket->scheduler_entry).fd;
    bVar2 = (pktsocket->config).dont_route & 1;
    if (remote == (netaddr_socket *)0x0) {
      iVar7 = 0;
      if (bVar2 != 0) {
        iVar7 = 4;
      }
      sVar3 = send(poVar8->fd,data,length,iVar7);
      local_50 = (int)sVar3;
    }
    else {
      iVar7 = 0;
      if (bVar2 != 0) {
        iVar7 = 4;
      }
      sVar3 = sendto(poVar8->fd,data,length,iVar7,(sockaddr *)&remote->v4,0x80);
      local_50 = (int)sVar3;
    }
    oVar1 = _oonf_packet_socket_subsystem.logging;
    buf.buf._54_4_ = local_50;
    if (0 < local_50) {
      if (((&log_global_mask)[_oonf_packet_socket_subsystem.logging] & 1) != 0) {
        uVar4 = netaddr_socket_to_string(local_ea,remote);
        if (pktsocket->os_if == (os_interface *)0x0) {
          local_108 = "";
        }
        else {
          local_108 = pktsocket->os_if->name;
        }
        oonf_log(1,oVar1,"src/base/oonf_packet_socket.c",0xe6,0,0,"Sent %d bytes to %s %s",
                 CONCAT44(uVar9,local_50),uVar4,local_108);
      }
      (pktsocket->scheduler_entry)._stat_send = (pktsocket->scheduler_entry)._stat_send + 1;
      return 0;
    }
    piVar5 = __errno_location();
    if (*piVar5 == 1) {
      _handle_errno1(pktsocket,remote);
      return -1;
    }
    piVar5 = __errno_location();
    if (((*piVar5 != 4) && (piVar5 = __errno_location(), *piVar5 != 0xb)) &&
       (piVar5 = __errno_location(), oVar1 = _oonf_packet_socket_subsystem.logging, *piVar5 != 0xb))
    {
      if (((&log_global_mask)[_oonf_packet_socket_subsystem.logging] & 4) != 0) {
        uVar4 = netaddr_socket_to_string(local_ea,remote);
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        piVar5 = __errno_location();
        oonf_log(4,oVar1,"src/base/oonf_packet_socket.c",0xf1,0,0,
                 "Cannot send UDP packet to %s: %s (%d)",uVar4,pcVar6,CONCAT44(uVar10,*piVar5));
      }
      return -1;
    }
  }
  abuf_memcpy(&pktsocket->out,remote,0x80);
  local_18 = &pktsocket->out;
  local_1a = (undefined2)stack0xffffffffffffff58;
  abuf_memcpy(local_18,&local_1a,2);
  abuf_memcpy(&pktsocket->out,data,stack0xffffffffffffff58);
  oonf_socket_set_write(&pktsocket->scheduler_entry,true);
  return 0;
}

Assistant:

int
oonf_packet_send(struct oonf_packet_socket *pktsocket, union netaddr_socket *remote, const void *data, size_t length) {
  int result;
  struct netaddr_str buf;

  if (abuf_getlen(&pktsocket->out) == 0) {
    /* no backlog of outgoing packets, try to send directly */
    result = os_fd_sendto(&pktsocket->scheduler_entry.fd, data, length, remote, pktsocket->config.dont_route);
    if (result > 0) {
      /* successful */
      OONF_DEBUG(LOG_PACKET, "Sent %d bytes to %s %s", result, netaddr_socket_to_string(&buf, remote),
        pktsocket->os_if != NULL ? pktsocket->os_if->name : "");
      oonf_socket_register_direct_send(&pktsocket->scheduler_entry);
      return 0;
    }

    if (errno == EPERM) {
      _handle_errno1(pktsocket, remote);
      return -1;
    }
    if (errno != EINTR && errno != EAGAIN && errno != EWOULDBLOCK) {
      OONF_WARN(LOG_PACKET, "Cannot send UDP packet to %s: %s (%d)", netaddr_socket_to_string(&buf, remote),
        strerror(errno), errno);
      return -1;
    }
  }

  /* append destination */
  abuf_memcpy(&pktsocket->out, remote, sizeof(*remote));

  /* append data length */
  abuf_append_uint16(&pktsocket->out, length);

  /* append data */
  abuf_memcpy(&pktsocket->out, data, length);

  /* activate outgoing socket scheduler */
  oonf_socket_set_write(&pktsocket->scheduler_entry, true);
  return 0;
}